

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3IncrmergeChomp(Fts3Table *p,sqlite3_int64 iAbsLevel,Fts3MultiSegReader *pCsr,int *pnRem)

{
  uint uVar1;
  int *in_RCX;
  long *in_RDX;
  sqlite3_int64 in_RSI;
  Fts3Table *in_RDI;
  int nTerm;
  char *zTerm;
  int j;
  Fts3SegReader *pSeg;
  int rc;
  int nRem;
  int i;
  Fts3SegReader *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  sqlite3_int64 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  int *local_38;
  uint in_stack_ffffffffffffffd0;
  int iVar3;
  int iVar4;
  int nTerm_00;
  
  iVar4 = 0;
  iVar3 = 0;
  nTerm_00 = (int)in_RDX[1];
  while( true ) {
    nTerm_00 = nTerm_00 + -1;
    uVar1 = in_stack_ffffffffffffffb0 & 0xffffff;
    if (-1 < nTerm_00) {
      uVar1 = CONCAT13(iVar3 == 0,(int3)in_stack_ffffffffffffffb0);
    }
    in_stack_ffffffffffffffb0 = uVar1;
    if ((char)(in_stack_ffffffffffffffb0 >> 0x18) == '\0') break;
    local_38 = (int *)0x0;
    iVar2 = 0;
    while ((iVar2 < (int)in_RDX[1] &&
           (local_38 = *(int **)(*in_RDX + (long)iVar2 * 8), *local_38 != nTerm_00))) {
      iVar2 = iVar2 + 1;
    }
    if (*(long *)(local_38 + 10) == 0) {
      iVar3 = fts3DeleteSegment((Fts3Table *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffa8);
      if (iVar3 == 0) {
        iVar3 = fts3RemoveSegdirEntry
                          ((Fts3Table *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
      }
      *in_RCX = 0;
    }
    else {
      in_stack_ffffffffffffffb8 = *(sqlite3_int64 *)(local_38 + 0x14);
      in_stack_ffffffffffffffb4 = local_38[0x12];
      iVar3 = fts3TruncateSegment(in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),(char *)in_RCX,nTerm_00
                                 );
      iVar4 = iVar4 + 1;
    }
  }
  if ((iVar3 == 0) && (iVar4 != (int)in_RDX[1])) {
    iVar3 = fts3RepackSegdirLevel
                      ((Fts3Table *)CONCAT44(nTerm_00,iVar4),(ulong)in_stack_ffffffffffffffd0);
  }
  *in_RCX = iVar4;
  return iVar3;
}

Assistant:

static int fts3IncrmergeChomp(
  Fts3Table *p,                   /* FTS table handle */
  sqlite3_int64 iAbsLevel,        /* Absolute level containing segments */
  Fts3MultiSegReader *pCsr,       /* Chomp all segments opened by this cursor */
  int *pnRem                      /* Number of segments not deleted */
){
  int i;
  int nRem = 0;
  int rc = SQLITE_OK;

  for(i=pCsr->nSegment-1; i>=0 && rc==SQLITE_OK; i--){
    Fts3SegReader *pSeg = 0;
    int j;

    /* Find the Fts3SegReader object with Fts3SegReader.iIdx==i. It is hiding
    ** somewhere in the pCsr->apSegment[] array.  */
    for(j=0; ALWAYS(j<pCsr->nSegment); j++){
      pSeg = pCsr->apSegment[j];
      if( pSeg->iIdx==i ) break;
    }
    assert( j<pCsr->nSegment && pSeg->iIdx==i );

    if( pSeg->aNode==0 ){
      /* Seg-reader is at EOF. Remove the entire input segment. */
      rc = fts3DeleteSegment(p, pSeg);
      if( rc==SQLITE_OK ){
        rc = fts3RemoveSegdirEntry(p, iAbsLevel, pSeg->iIdx);
      }
      *pnRem = 0;
    }else{
      /* The incremental merge did not copy all the data from this
      ** segment to the upper level. The segment is modified in place
      ** so that it contains no keys smaller than zTerm/nTerm. */
      const char *zTerm = pSeg->zTerm;
      int nTerm = pSeg->nTerm;
      rc = fts3TruncateSegment(p, iAbsLevel, pSeg->iIdx, zTerm, nTerm);
      nRem++;
    }
  }

  if( rc==SQLITE_OK && nRem!=pCsr->nSegment ){
    rc = fts3RepackSegdirLevel(p, iAbsLevel);
  }

  *pnRem = nRem;
  return rc;
}